

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::xpressive::detail::
  get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(void)

{
  int iVar1;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000010;
  matchable_ptr *in_stack_ffffffffffffffe8;
  shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffff0;
  
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_xpr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_xpr_abi_cxx11_);
    if (iVar1 != 0) {
      invalid_xpression<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::invalid_xpression((invalid_xpression<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(unaff_retaddr_00,unaff_retaddr));
      __cxa_atexit(invalid_xpression<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~invalid_xpression,
                   &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                    ::invalid_xpr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_xpr_abi_cxx11_);
    }
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_ptr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_ptr_abi_cxx11_);
    if (iVar1 != 0) {
      intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::intrusive_ptr(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00);
      __cxa_atexit(intrusive_ptr<const_boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~intrusive_ptr,
                   &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                    ::invalid_ptr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_ptr_abi_cxx11_);
    }
  }
  if (get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
      invalid_matchable_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                                 ::invalid_matchable_abi_cxx11_);
    if (iVar1 != 0) {
      shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::shared_matchable(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
      __cxa_atexit(shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~shared_matchable,
                   &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                    ::invalid_matchable_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()
                           ::invalid_matchable_abi_cxx11_);
    }
  }
  return &get_invalid_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>()::
          invalid_matchable_abi_cxx11_;
}

Assistant:

inline shared_matchable<BidiIter> const &get_invalid_xpression()
{
    static invalid_xpression<BidiIter> const invalid_xpr;
    static intrusive_ptr<matchable_ex<BidiIter> const> const invalid_ptr(&invalid_xpr);
    static shared_matchable<BidiIter> const invalid_matchable(invalid_ptr);
    return invalid_matchable;
}